

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::ExactCompareDistances(Vector3_xf *x,Vector3_xf *a,Vector3_xf *b)

{
  int iVar1;
  int iVar2;
  ExactFloat cos_bx;
  ExactFloat cos_ax;
  ExactFloat cmp;
  ExactFloat local_b0;
  ExactFloat local_a0;
  BasicVector<Vector3,_ExactFloat,_3UL> local_90 [8];
  BIGNUM *local_88;
  ExactFloat local_80;
  ExactFloat local_70;
  BasicVector<Vector3,_ExactFloat,_3UL> local_60 [8];
  BIGNUM *local_58;
  ExactFloat local_50;
  ExactFloat local_40;
  ExactFloat local_30;
  
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_a0,x);
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_b0,x);
  iVar2 = 0;
  if ((local_a0.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
    iVar2 = local_a0.sign_;
  }
  iVar1 = 0;
  if ((local_b0.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
    iVar1 = local_b0.sign_;
  }
  if (iVar2 == iVar1) {
    operator*(&local_50,&local_b0);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd(local_60,a);
    operator*(&local_40,&local_50);
    operator*(&local_80,&local_a0);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd(local_90,b);
    operator*(&local_70,&local_80);
    operator-(&local_30,&local_40);
    BN_free((BIGNUM *)local_70.bn_.bn_);
    BN_free(local_88);
    BN_free((BIGNUM *)local_80.bn_.bn_);
    BN_free((BIGNUM *)local_40.bn_.bn_);
    BN_free(local_58);
    BN_free((BIGNUM *)local_50.bn_.bn_);
    BN_free((BIGNUM *)local_30.bn_.bn_);
    if ((local_30.bn_exp_ & 0xfffffffdU) == 0x7ffffffd) {
      local_30.sign_ = 0;
    }
    iVar2 = local_30.sign_ * iVar2;
  }
  else {
    iVar2 = (uint)(iVar2 <= iVar1) * 2 + -1;
  }
  BN_free((BIGNUM *)local_b0.bn_.bn_);
  BN_free((BIGNUM *)local_a0.bn_.bn_);
  return iVar2;
}

Assistant:

int ExactCompareDistances(const Vector3_xf& x,
                          const Vector3_xf& a, const Vector3_xf& b) {
  // This code produces the same result as though all points were reprojected
  // to lie exactly on the surface of the unit sphere.  It is based on testing
  // whether x.DotProd(a.Normalize()) < x.DotProd(b.Normalize()), reformulated
  // so that it can be evaluated using exact arithmetic.
  ExactFloat cos_ax = x.DotProd(a);
  ExactFloat cos_bx = x.DotProd(b);
  // If the two values have different signs, we need to handle that case now
  // before squaring them below.
  int a_sign = cos_ax.sgn(), b_sign = cos_bx.sgn();
  if (a_sign != b_sign) {
    return (a_sign > b_sign) ? -1 : 1;  // If cos(AX) > cos(BX), then AX < BX.
  }
  ExactFloat cmp = cos_bx * cos_bx * a.Norm2() - cos_ax * cos_ax * b.Norm2();
  return a_sign * cmp.sgn();
}